

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticlePairs.test.cpp
# Opt level: O1

void verifyChunk(ParticlePairs *chunk)

{
  bool bVar1;
  long lVar2;
  member_size_t<ranges::subrange<__gnu_cxx::__normal_iterator<const_double_*,_std::vector<double>_>_>_&>
  n;
  long lVar3;
  int iVar4;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef macroName_19;
  StringRef macroName_20;
  StringRef macroName_21;
  StringRef macroName_22;
  StringRef macroName_23;
  StringRef macroName_24;
  StringRef macroName_25;
  StringRef macroName_26;
  StringRef macroName_27;
  StringRef macroName_28;
  StringRef macroName_29;
  StringRef macroName_30;
  StringRef macroName_31;
  StringRef macroName_32;
  StringRef macroName_33;
  StringRef macroName_34;
  StringRef macroName_35;
  StringRef macroName_36;
  StringRef macroName_37;
  StringRef macroName_38;
  StringRef macroName_39;
  StringRef macroName_40;
  StringRef macroName_41;
  StringRef macroName_42;
  StringRef macroName_43;
  StringRef macroName_44;
  StringRef macroName_45;
  StringRef macroName_46;
  StringRef macroName_47;
  StringRef macroName_48;
  StringRef macroName_49;
  StringRef macroName_50;
  StringRef macroName_51;
  StringRef macroName_52;
  StringRef macroName_53;
  StringRef macroName_54;
  StringRef macroName_55;
  StringRef macroName_56;
  StringRef macroName_57;
  StringRef macroName_58;
  StringRef macroName_59;
  StringRef macroName_60;
  StringRef macroName_61;
  StringRef macroName_62;
  StringRef macroName_63;
  StringRef macroName_64;
  StringRef macroName_65;
  StringRef macroName_66;
  StringRef macroName_67;
  StringRef macroName_68;
  StringRef macroName_69;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  StringRef capturedExpression_19;
  StringRef capturedExpression_20;
  StringRef capturedExpression_21;
  StringRef capturedExpression_22;
  StringRef capturedExpression_23;
  StringRef capturedExpression_24;
  StringRef capturedExpression_25;
  StringRef capturedExpression_26;
  StringRef capturedExpression_27;
  StringRef capturedExpression_28;
  StringRef capturedExpression_29;
  StringRef capturedExpression_30;
  StringRef capturedExpression_31;
  StringRef capturedExpression_32;
  StringRef capturedExpression_33;
  StringRef capturedExpression_34;
  StringRef capturedExpression_35;
  StringRef capturedExpression_36;
  StringRef capturedExpression_37;
  StringRef capturedExpression_38;
  StringRef capturedExpression_39;
  StringRef capturedExpression_40;
  StringRef capturedExpression_41;
  StringRef capturedExpression_42;
  StringRef capturedExpression_43;
  StringRef capturedExpression_44;
  StringRef capturedExpression_45;
  StringRef capturedExpression_46;
  StringRef capturedExpression_47;
  StringRef capturedExpression_48;
  StringRef capturedExpression_49;
  StringRef capturedExpression_50;
  StringRef capturedExpression_51;
  StringRef capturedExpression_52;
  StringRef capturedExpression_53;
  StringRef capturedExpression_54;
  StringRef capturedExpression_55;
  StringRef capturedExpression_56;
  StringRef capturedExpression_57;
  StringRef capturedExpression_58;
  StringRef capturedExpression_59;
  StringRef capturedExpression_60;
  StringRef capturedExpression_61;
  StringRef capturedExpression_62;
  StringRef capturedExpression_63;
  StringRef capturedExpression_64;
  StringRef capturedExpression_65;
  StringRef capturedExpression_66;
  StringRef capturedExpression_67;
  StringRef capturedExpression_68;
  StringRef capturedExpression_69;
  AssertionHandler catchAssertionHandler;
  AssertionHandler local_270;
  undefined1 local_228 [8];
  undefined8 local_220;
  pointer local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  double local_200;
  undefined1 local_1f8;
  char local_1f7;
  undefined1 local_1f0 [9];
  bool bStack_1e7;
  undefined6 uStack_1e6;
  undefined4 uStack_1e4;
  double *local_1e0;
  WithinRelMatcher *local_1d8;
  long local_1d0;
  undefined1 local_1c8 [9];
  bool bStack_1bf;
  undefined6 uStack_1be;
  iterator_t<CRng> *local_1b8;
  WithinRelMatcher *local_1b0;
  iterator_t<CRng> local_1a8;
  undefined8 *local_1a0;
  undefined1 *local_198;
  iterator_t<CRng> local_190;
  undefined1 *local_188;
  iterator_t<CRng> local_180;
  undefined1 *local_178;
  iterator_t<CRng> local_170;
  undefined1 *local_168;
  iterator_t<CRng> local_160;
  undefined1 *local_158;
  iterator_t<CRng> local_150;
  undefined1 *local_148;
  iterator_t<CRng> local_140;
  undefined1 *local_138;
  iterator_t<CRng> local_130;
  undefined1 *local_128;
  iterator_t<CRng> local_120;
  undefined1 *local_118;
  iterator_t<CRng> local_110;
  undefined1 *local_108;
  iterator_t<CRng> local_100;
  undefined1 *local_f8;
  iterator_t<CRng> local_f0;
  undefined1 *local_e8;
  iterator_t<CRng> local_e0;
  undefined1 *local_d8;
  iterator_t<CRng> local_d0;
  undefined1 *local_c8;
  iterator_t<CRng> local_c0;
  undefined1 *local_b8;
  iterator_t<CRng> local_b0;
  undefined1 *local_a8;
  iterator_t<CRng> local_a0;
  undefined1 *local_98;
  iterator_t<CRng> local_90;
  undefined1 *local_88;
  double local_80;
  iterator_t<CRng> local_78;
  undefined8 *local_70;
  undefined1 *local_68;
  iterator_t<CRng> local_60;
  undefined8 *local_58;
  undefined1 *local_50;
  iterator_t<CRng> local_48;
  undefined8 *local_40;
  undefined1 *local_38;
  
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xcb;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x11;
  capturedExpression.m_start = "1 == chunk.NJSX()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName,(SourceLineInfo *)local_228,capturedExpression,ContinueOnFailure);
  local_210._8_4_ =
       (undefined4)
       (chunk->super_ListRecord).metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Head_base<3UL,_long,_false>._M_head_impl;
  local_220._1_1_ = local_210._8_4_ == 1;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d4178;
  local_220._4_4_ = 1;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xcc;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x1d;
  capturedExpression_00.m_start = "1 == chunk.numberSpinGroups()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_00,(SourceLineInfo *)local_228,capturedExpression_00,
             ContinueOnFailure);
  iVar4 = (int)(chunk->super_ListRecord).metadata.fields.
               super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
               super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
               super__Tuple_impl<2UL,_long,_long,_long,_long>.
               super__Tuple_impl<3UL,_long,_long,_long>.super__Head_base<3UL,_long,_false>.
               _M_head_impl;
  local_220._1_1_ = iVar4 == 1;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d4178;
  local_220._4_4_ = 1;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  local_210._8_4_ = iVar4;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xce;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x10;
  capturedExpression_01.m_start = "2 == chunk.NPP()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_01,(SourceLineInfo *)local_228,capturedExpression_01,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
  iVar4 = (int)((ulong)((lVar2 >> 3) / 6 + (lVar2 >> 0x3f)) >> 1) - (int)(lVar2 >> 0x3f);
  local_220._1_1_ = iVar4 == 2;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41b8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  local_210._8_4_ = iVar4;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xcf;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0x20;
  capturedExpression_02.m_start = "2 == chunk.numberParticlePairs()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_02,(SourceLineInfo *)local_228,capturedExpression_02,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start;
  iVar4 = (int)((ulong)((lVar2 >> 3) / 6 + (lVar2 >> 0x3f)) >> 1) - (int)(lVar2 >> 0x3f);
  local_220._1_1_ = iVar4 == 2;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41b8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  local_210._8_4_ = iVar4;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xd0;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0x16;
  capturedExpression_03.m_start = "2 == chunk.MA().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_03,(SourceLineInfo *)local_228,capturedExpression_03,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xd1;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0x21;
  capturedExpression_04.m_start = "2 == chunk.massParticleA().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_04,(SourceLineInfo *)local_228,capturedExpression_04,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_start >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xd2;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0x16;
  capturedExpression_05.m_start = "2 == chunk.MB().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_05,(SourceLineInfo *)local_228,capturedExpression_05,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-8 - (long)(chunk->super_ListRecord).data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xd3;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x21;
  capturedExpression_06.m_start = "2 == chunk.massParticleB().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_06,(SourceLineInfo *)local_228,capturedExpression_06,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-8 - (long)(chunk->super_ListRecord).data.
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xd4;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0x16;
  capturedExpression_07.m_start = "2 == chunk.ZA().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_07,(SourceLineInfo *)local_228,capturedExpression_07,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x10 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xd5;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x23;
  capturedExpression_08.m_start = "2 == chunk.chargeParticleA().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_08,(SourceLineInfo *)local_228,capturedExpression_08,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x10 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xd6;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0x16;
  capturedExpression_09.m_start = "2 == chunk.ZB().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_09,(SourceLineInfo *)local_228,capturedExpression_09,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x18 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xd7;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x23;
  capturedExpression_10.m_start = "2 == chunk.chargeParticleB().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_10,(SourceLineInfo *)local_228,capturedExpression_10,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x18 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xd8;
  macroName_11.m_size = 5;
  macroName_11.m_start = "CHECK";
  capturedExpression_11.m_size = 0x16;
  capturedExpression_11.m_start = "2 == chunk.IA().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_11,(SourceLineInfo *)local_228,capturedExpression_11,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x20 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xd9;
  macroName_12.m_size = 5;
  macroName_12.m_start = "CHECK";
  capturedExpression_12.m_size = 0x21;
  capturedExpression_12.m_start = "2 == chunk.spinParticleA().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_12,(SourceLineInfo *)local_228,capturedExpression_12,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x20 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xda;
  macroName_13.m_size = 5;
  macroName_13.m_start = "CHECK";
  capturedExpression_13.m_size = 0x16;
  capturedExpression_13.m_start = "2 == chunk.IB().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_13,(SourceLineInfo *)local_228,capturedExpression_13,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x28 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xdb;
  macroName_14.m_size = 5;
  macroName_14.m_start = "CHECK";
  capturedExpression_14.m_size = 0x21;
  capturedExpression_14.m_start = "2 == chunk.spinParticleB().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_14,(SourceLineInfo *)local_228,capturedExpression_14,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x28 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xdc;
  macroName_15.m_size = 5;
  macroName_15.m_start = "CHECK";
  capturedExpression_15.m_size = 0x16;
  capturedExpression_15.m_start = "2 == chunk.PA().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_15,(SourceLineInfo *)local_228,capturedExpression_15,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x50 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xdd;
  macroName_16.m_size = 5;
  macroName_16.m_start = "CHECK";
  capturedExpression_16.m_size = 0x23;
  capturedExpression_16.m_start = "2 == chunk.parityParticleA().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_16,(SourceLineInfo *)local_228,capturedExpression_16,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x50 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xde;
  macroName_17.m_size = 5;
  macroName_17.m_start = "CHECK";
  capturedExpression_17.m_size = 0x16;
  capturedExpression_17.m_start = "2 == chunk.PB().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_17,(SourceLineInfo *)local_228,capturedExpression_17,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x58 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xdf;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x23;
  capturedExpression_18.m_start = "2 == chunk.parityParticleB().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_18,(SourceLineInfo *)local_228,capturedExpression_18,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x58 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xe0;
  macroName_19.m_size = 5;
  macroName_19.m_start = "CHECK";
  capturedExpression_19.m_size = 0x15;
  capturedExpression_19.m_start = "2 == chunk.Q().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_19,(SourceLineInfo *)local_228,capturedExpression_19,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x30 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xe1;
  macroName_20.m_size = 5;
  macroName_20.m_start = "CHECK";
  capturedExpression_20.m_size = 0x17;
  capturedExpression_20.m_start = "2 == chunk.PNT().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_20,(SourceLineInfo *)local_228,capturedExpression_20,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x38 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xe2;
  macroName_21.m_size = 5;
  macroName_21.m_start = "CHECK";
  capturedExpression_21.m_size = 0x25;
  capturedExpression_21.m_start = "2 == chunk.penetrabilityFlag().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_21,(SourceLineInfo *)local_228,capturedExpression_21,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x38 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xe3;
  macroName_22.m_size = 5;
  macroName_22.m_start = "CHECK";
  capturedExpression_22.m_size = 0x17;
  capturedExpression_22.m_start = "2 == chunk.SHF().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_22,(SourceLineInfo *)local_228,capturedExpression_22,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x40 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xe4;
  macroName_23.m_size = 5;
  macroName_23.m_start = "CHECK";
  capturedExpression_23.m_size = 0x23;
  capturedExpression_23.m_start = "2 == chunk.shiftFactorFlag().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_23,(SourceLineInfo *)local_228,capturedExpression_23,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x40 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xe5;
  macroName_24.m_size = 5;
  macroName_24.m_start = "CHECK";
  capturedExpression_24.m_size = 0x16;
  capturedExpression_24.m_start = "2 == chunk.MT().size()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_24,(SourceLineInfo *)local_228,capturedExpression_24,
             ContinueOnFailure);
  lVar2 = (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
                _M_impl.super__Vector_impl_data._M_finish +
          (-0x48 - (long)(chunk->super_ListRecord).data.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3;
  local_210._8_8_ = (lVar2 + 0xbU) / 0xc;
  local_220._1_1_ = lVar2 - 0xdU < 0xc;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d41f8;
  local_220._4_4_ = 2;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xe7;
  macroName_25.m_size = 10;
  macroName_25.m_start = "CHECK_THAT";
  capturedExpression_25.m_size = 0x1e;
  capturedExpression_25.m_start = "0., WithinRel( chunk.MA()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_25,(SourceLineInfo *)local_228,capturedExpression_25,
             ContinueOnFailure);
  local_1c8._0_8_ = (_func_int **)0x0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_228,
             *(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)local_1c8);
  bStack_1e7 = bVar1;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1e0 = (double *)local_1c8;
  local_1d8 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xe8;
  macroName_26.m_size = 10;
  macroName_26.m_start = "CHECK_THAT";
  capturedExpression_26.m_size = 0x1e;
  capturedExpression_26.m_start = "1., WithinRel( chunk.MA()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_26,(SourceLineInfo *)local_228,capturedExpression_26,
             ContinueOnFailure);
  local_1a8._M_current = (double *)0x3ff0000000000000;
  local_1e0 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_178 = local_1f0;
  local_1d8 = (WithinRelMatcher *)0xc;
  lVar3 = (long)unique0x00012000 - (long)local_1e0 >> 3;
  lVar2 = (long)unique0x00012000 - (long)local_1e0 >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_1d0 = 0xc - lVar3;
  if (lVar3 == 0) {
    local_1d0 = 0;
  }
  local_180._M_current = local_1e0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_178,&local_180,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_228,*local_180._M_current);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)&local_1a8);
  bStack_1bf = bVar1;
  local_1c8[8] = true;
  local_1c8._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1b8 = &local_1a8;
  local_1b0 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xe9;
  macroName_27.m_size = 10;
  macroName_27.m_start = "CHECK_THAT";
  capturedExpression_27.m_size = 0x28;
  capturedExpression_27.m_start = "0, WithinRel( chunk.massParticleA()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_27,(SourceLineInfo *)local_228,capturedExpression_27,
             ContinueOnFailure);
  local_1c8._0_8_ = local_1c8._0_8_ & 0xffffffff00000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_228,
             *(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_80 = (double)(int)local_1c8._0_4_;
  bVar1 = Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_228,&local_80);
  bStack_1e7 = bVar1;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4278;
  local_1e0 = (double *)local_1c8;
  local_1d8 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xea;
  macroName_28.m_size = 10;
  macroName_28.m_start = "CHECK_THAT";
  capturedExpression_28.m_size = 0x28;
  capturedExpression_28.m_start = "1, WithinRel( chunk.massParticleA()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_28,(SourceLineInfo *)local_228,capturedExpression_28,
             ContinueOnFailure);
  local_1a8._M_current._0_4_ = 1;
  local_1e0 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1d8 = (WithinRelMatcher *)0xc;
  lVar3 = (long)unique0x00012000 - (long)local_1e0 >> 3;
  lVar2 = (long)unique0x00012000 - (long)local_1e0 >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_1d0 = 0xc - lVar3;
  if (lVar3 == 0) {
    local_1d0 = 0;
  }
  local_188 = local_1f0;
  local_190._M_current = local_1e0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_188,&local_190,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_228,*local_190._M_current);
  local_190._M_current = (double *)(double)(int)local_1a8._M_current;
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)&local_190);
  bStack_1bf = bVar1;
  local_1c8[8] = true;
  local_1c8._0_8_ = &PTR_streamReconstructedExpression_001d4278;
  local_1b8 = &local_1a8;
  local_1b0 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xeb;
  macroName_29.m_size = 10;
  macroName_29.m_start = "CHECK_THAT";
  capturedExpression_29.m_size = 0x27;
  capturedExpression_29.m_start = "5.446635e+1, WithinRel( chunk.MB()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_29,(SourceLineInfo *)local_228,capturedExpression_29,
             ContinueOnFailure);
  local_1c8._0_8_ = (_func_int **)0x404b3bb15b573eab;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_228,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)local_1c8);
  bStack_1e7 = bVar1;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1e0 = (double *)local_1c8;
  local_1d8 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xec;
  macroName_30.m_size = 10;
  macroName_30.m_start = "CHECK_THAT";
  capturedExpression_30.m_size = 0x27;
  capturedExpression_30.m_start = "5.347624e+1, WithinRel( chunk.MB()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_30,(SourceLineInfo *)local_228,capturedExpression_30,
             ContinueOnFailure);
  local_1a8._M_current = (double *)0x404abcf56eac8605;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1e0 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start + 1;
  local_1d8 = (WithinRelMatcher *)0xc;
  lVar3 = (long)unique0x00012000 - (long)local_1e0 >> 3;
  lVar2 = (long)unique0x00012000 - (long)local_1e0 >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_1d0 = 0xc - lVar3;
  if (lVar3 == 0) {
    local_1d0 = 0;
  }
  local_168 = local_1f0;
  local_170._M_current = local_1e0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_168,&local_170,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_228,*local_170._M_current);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)&local_1a8);
  bStack_1bf = bVar1;
  local_1c8[8] = true;
  local_1c8._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1b8 = &local_1a8;
  local_1b0 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xed;
  macroName_31.m_size = 10;
  macroName_31.m_start = "CHECK_THAT";
  capturedExpression_31.m_size = 0x32;
  capturedExpression_31.m_start = "5.446635e+1, WithinRel( chunk.massParticleB()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_31,(SourceLineInfo *)local_228,capturedExpression_31,
             ContinueOnFailure);
  local_1c8._0_8_ = (_func_int **)0x404b3bb15b573eab;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_228,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[1]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)local_1c8);
  bStack_1e7 = bVar1;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1e0 = (double *)local_1c8;
  local_1d8 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xee;
  macroName_32.m_size = 10;
  macroName_32.m_start = "CHECK_THAT";
  capturedExpression_32.m_size = 0x32;
  capturedExpression_32.m_start = "5.347624e+1, WithinRel( chunk.massParticleB()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_32,(SourceLineInfo *)local_228,capturedExpression_32,
             ContinueOnFailure);
  local_1a8._M_current = (double *)0x404abcf56eac8605;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1e0 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start + 1;
  local_1d8 = (WithinRelMatcher *)0xc;
  lVar3 = (long)unique0x00012000 - (long)local_1e0 >> 3;
  lVar2 = (long)unique0x00012000 - (long)local_1e0 >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_1d0 = 0xc - lVar3;
  if (lVar3 == 0) {
    local_1d0 = 0;
  }
  local_158 = local_1f0;
  local_160._M_current = local_1e0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_158,&local_160,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_228,*local_160._M_current);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)&local_1a8);
  bStack_1bf = bVar1;
  local_1c8[8] = true;
  local_1c8._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1b8 = &local_1a8;
  local_1b0 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xef;
  macroName_33.m_size = 10;
  macroName_33.m_start = "CHECK_THAT";
  capturedExpression_33.m_size = 0x1e;
  capturedExpression_33.m_start = "2., WithinRel( chunk.ZA()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_33,(SourceLineInfo *)local_228,capturedExpression_33,
             ContinueOnFailure);
  local_1c8._0_8_ = (_func_int **)0x4000000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_228,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[2]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)local_1c8);
  bStack_1e7 = bVar1;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1e0 = (double *)local_1c8;
  local_1d8 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xf0;
  macroName_34.m_size = 10;
  macroName_34.m_start = "CHECK_THAT";
  capturedExpression_34.m_size = 0x1e;
  capturedExpression_34.m_start = "3., WithinRel( chunk.ZA()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_34,(SourceLineInfo *)local_228,capturedExpression_34,
             ContinueOnFailure);
  local_1a8._M_current = (double *)0x4008000000000000;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1e0 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start + 2;
  local_1d8 = (WithinRelMatcher *)0xc;
  lVar3 = (long)unique0x00012000 - (long)local_1e0 >> 3;
  lVar2 = (long)unique0x00012000 - (long)local_1e0 >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_1d0 = 0xc - lVar3;
  if (lVar3 == 0) {
    local_1d0 = 0;
  }
  local_148 = local_1f0;
  local_150._M_current = local_1e0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_148,&local_150,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_228,*local_150._M_current);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)&local_1a8);
  bStack_1bf = bVar1;
  local_1c8[8] = true;
  local_1c8._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1b8 = &local_1a8;
  local_1b0 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xf1;
  macroName_35.m_size = 10;
  macroName_35.m_start = "CHECK_THAT";
  capturedExpression_35.m_size = 0x2b;
  capturedExpression_35.m_start = "2., WithinRel( chunk.chargeParticleA()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_35,(SourceLineInfo *)local_228,capturedExpression_35,
             ContinueOnFailure);
  local_1c8._0_8_ = (_func_int **)0x4000000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_228,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[2]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)local_1c8);
  bStack_1e7 = bVar1;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1e0 = (double *)local_1c8;
  local_1d8 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xf2;
  macroName_36.m_size = 10;
  macroName_36.m_start = "CHECK_THAT";
  capturedExpression_36.m_size = 0x2b;
  capturedExpression_36.m_start = "3., WithinRel( chunk.chargeParticleA()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_36,(SourceLineInfo *)local_228,capturedExpression_36,
             ContinueOnFailure);
  local_1a8._M_current = (double *)0x4008000000000000;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1e0 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start + 2;
  local_1d8 = (WithinRelMatcher *)0xc;
  lVar3 = (long)unique0x00012000 - (long)local_1e0 >> 3;
  lVar2 = (long)unique0x00012000 - (long)local_1e0 >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_1d0 = 0xc - lVar3;
  if (lVar3 == 0) {
    local_1d0 = 0;
  }
  local_138 = local_1f0;
  local_140._M_current = local_1e0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_138,&local_140,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_228,*local_140._M_current);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)&local_1a8);
  bStack_1bf = bVar1;
  local_1c8[8] = true;
  local_1c8._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1b8 = &local_1a8;
  local_1b0 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xf3;
  macroName_37.m_size = 10;
  macroName_37.m_start = "CHECK_THAT";
  capturedExpression_37.m_size = 0x1f;
  capturedExpression_37.m_start = "26., WithinRel( chunk.ZB()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_37,(SourceLineInfo *)local_228,capturedExpression_37,
             ContinueOnFailure);
  local_1c8._0_8_ = (_func_int **)0x403a000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_228,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[3]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)local_1c8);
  bStack_1e7 = bVar1;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1e0 = (double *)local_1c8;
  local_1d8 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xf4;
  macroName_38.m_size = 10;
  macroName_38.m_start = "CHECK_THAT";
  capturedExpression_38.m_size = 0x1f;
  capturedExpression_38.m_start = "27., WithinRel( chunk.ZB()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_38,(SourceLineInfo *)local_228,capturedExpression_38,
             ContinueOnFailure);
  local_1a8._M_current = (double *)0x403b000000000000;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1e0 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start + 3;
  local_1d8 = (WithinRelMatcher *)0xc;
  lVar3 = (long)unique0x00012000 - (long)local_1e0 >> 3;
  lVar2 = (long)unique0x00012000 - (long)local_1e0 >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_1d0 = 0xc - lVar3;
  if (lVar3 == 0) {
    local_1d0 = 0;
  }
  local_128 = local_1f0;
  local_130._M_current = local_1e0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_128,&local_130,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_228,*local_130._M_current);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)&local_1a8);
  bStack_1bf = bVar1;
  local_1c8[8] = true;
  local_1c8._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1b8 = &local_1a8;
  local_1b0 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xf5;
  macroName_39.m_size = 10;
  macroName_39.m_start = "CHECK_THAT";
  capturedExpression_39.m_size = 0x2c;
  capturedExpression_39.m_start = "26., WithinRel( chunk.chargeParticleB()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_39,(SourceLineInfo *)local_228,capturedExpression_39,
             ContinueOnFailure);
  local_1c8._0_8_ = (_func_int **)0x403a000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_228,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[3]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)local_1c8);
  bStack_1e7 = bVar1;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1e0 = (double *)local_1c8;
  local_1d8 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xf6;
  macroName_40.m_size = 10;
  macroName_40.m_start = "CHECK_THAT";
  capturedExpression_40.m_size = 0x2c;
  capturedExpression_40.m_start = "27., WithinRel( chunk.chargeParticleB()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_40,(SourceLineInfo *)local_228,capturedExpression_40,
             ContinueOnFailure);
  local_1a8._M_current = (double *)0x403b000000000000;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1e0 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start + 3;
  local_1d8 = (WithinRelMatcher *)0xc;
  lVar3 = (long)unique0x00012000 - (long)local_1e0 >> 3;
  lVar2 = (long)unique0x00012000 - (long)local_1e0 >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_1d0 = 0xc - lVar3;
  if (lVar3 == 0) {
    local_1d0 = 0;
  }
  local_118 = local_1f0;
  local_120._M_current = local_1e0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_118,&local_120,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_228,*local_120._M_current);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)&local_1a8);
  bStack_1bf = bVar1;
  local_1c8[8] = true;
  local_1c8._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1b8 = &local_1a8;
  local_1b0 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xf7;
  macroName_41.m_size = 10;
  macroName_41.m_start = "CHECK_THAT";
  capturedExpression_41.m_size = 0x1e;
  capturedExpression_41.m_start = "1., WithinRel( chunk.IA()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_41,(SourceLineInfo *)local_228,capturedExpression_41,
             ContinueOnFailure);
  local_1c8._0_8_ = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_228,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[4]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)local_1c8);
  bStack_1e7 = bVar1;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1e0 = (double *)local_1c8;
  local_1d8 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xf8;
  macroName_42.m_size = 10;
  macroName_42.m_start = "CHECK_THAT";
  capturedExpression_42.m_size = 0x1f;
  capturedExpression_42.m_start = "0.5, WithinRel( chunk.IA()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_42,(SourceLineInfo *)local_228,capturedExpression_42,
             ContinueOnFailure);
  local_1a8._M_current = (double *)0x3fe0000000000000;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1e0 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start + 4;
  local_1d8 = (WithinRelMatcher *)0xc;
  lVar3 = (long)unique0x00012000 - (long)local_1e0 >> 3;
  lVar2 = (long)unique0x00012000 - (long)local_1e0 >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_1d0 = 0xc - lVar3;
  if (lVar3 == 0) {
    local_1d0 = 0;
  }
  local_108 = local_1f0;
  local_110._M_current = local_1e0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_108,&local_110,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_228,*local_110._M_current);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)&local_1a8);
  bStack_1bf = bVar1;
  local_1c8[8] = true;
  local_1c8._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1b8 = &local_1a8;
  local_1b0 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xf9;
  macroName_43.m_size = 10;
  macroName_43.m_start = "CHECK_THAT";
  capturedExpression_43.m_size = 0x29;
  capturedExpression_43.m_start = "1., WithinRel( chunk.spinParticleA()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_43,(SourceLineInfo *)local_228,capturedExpression_43,
             ContinueOnFailure);
  local_1c8._0_8_ = (_func_int **)0x3ff0000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_228,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[4]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)local_1c8);
  bStack_1e7 = bVar1;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1e0 = (double *)local_1c8;
  local_1d8 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xfa;
  macroName_44.m_size = 10;
  macroName_44.m_start = "CHECK_THAT";
  capturedExpression_44.m_size = 0x2a;
  capturedExpression_44.m_start = "0.5, WithinRel( chunk.spinParticleA()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_44,(SourceLineInfo *)local_228,capturedExpression_44,
             ContinueOnFailure);
  local_1a8._M_current = (double *)0x3fe0000000000000;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1e0 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start + 4;
  local_1d8 = (WithinRelMatcher *)0xc;
  lVar3 = (long)unique0x00012000 - (long)local_1e0 >> 3;
  lVar2 = (long)unique0x00012000 - (long)local_1e0 >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_1d0 = 0xc - lVar3;
  if (lVar3 == 0) {
    local_1d0 = 0;
  }
  local_f8 = local_1f0;
  local_100._M_current = local_1e0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_f8,&local_100,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_228,*local_100._M_current);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)&local_1a8);
  bStack_1bf = bVar1;
  local_1c8[8] = true;
  local_1c8._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1b8 = &local_1a8;
  local_1b0 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xfb;
  macroName_45.m_size = 10;
  macroName_45.m_start = "CHECK_THAT";
  capturedExpression_45.m_size = 0x1e;
  capturedExpression_45.m_start = "4., WithinRel( chunk.IB()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_45,(SourceLineInfo *)local_228,capturedExpression_45,
             ContinueOnFailure);
  local_1c8._0_8_ = (_func_int **)0x4010000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_228,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[5]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)local_1c8);
  bStack_1e7 = bVar1;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1e0 = (double *)local_1c8;
  local_1d8 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xfc;
  macroName_46.m_size = 10;
  macroName_46.m_start = "CHECK_THAT";
  capturedExpression_46.m_size = 0x1e;
  capturedExpression_46.m_start = "5., WithinRel( chunk.IB()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_46,(SourceLineInfo *)local_228,capturedExpression_46,
             ContinueOnFailure);
  local_1a8._M_current = (double *)0x4014000000000000;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1e0 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start + 5;
  local_1d8 = (WithinRelMatcher *)0xc;
  lVar3 = (long)unique0x00012000 - (long)local_1e0 >> 3;
  lVar2 = (long)unique0x00012000 - (long)local_1e0 >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_1d0 = 0xc - lVar3;
  if (lVar3 == 0) {
    local_1d0 = 0;
  }
  local_e8 = local_1f0;
  local_f0._M_current = local_1e0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_e8,&local_f0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_228,*local_f0._M_current);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)&local_1a8);
  bStack_1bf = bVar1;
  local_1c8[8] = true;
  local_1c8._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1b8 = &local_1a8;
  local_1b0 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xfd;
  macroName_47.m_size = 10;
  macroName_47.m_start = "CHECK_THAT";
  capturedExpression_47.m_size = 0x29;
  capturedExpression_47.m_start = "4., WithinRel( chunk.spinParticleB()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_47,(SourceLineInfo *)local_228,capturedExpression_47,
             ContinueOnFailure);
  local_1c8._0_8_ = (_func_int **)0x4010000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_228,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[5]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)local_1c8);
  bStack_1e7 = bVar1;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1e0 = (double *)local_1c8;
  local_1d8 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xfe;
  macroName_48.m_size = 10;
  macroName_48.m_start = "CHECK_THAT";
  capturedExpression_48.m_size = 0x29;
  capturedExpression_48.m_start = "5., WithinRel( chunk.spinParticleB()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_48,(SourceLineInfo *)local_228,capturedExpression_48,
             ContinueOnFailure);
  local_1a8._M_current = (double *)0x4014000000000000;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1e0 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start + 5;
  local_1d8 = (WithinRelMatcher *)0xc;
  lVar3 = (long)unique0x00012000 - (long)local_1e0 >> 3;
  lVar2 = (long)unique0x00012000 - (long)local_1e0 >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_1d0 = 0xc - lVar3;
  if (lVar3 == 0) {
    local_1d0 = 0;
  }
  local_d8 = local_1f0;
  local_e0._M_current = local_1e0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_d8,&local_e0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_228,*local_e0._M_current);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)&local_1a8);
  bStack_1bf = bVar1;
  local_1c8[8] = true;
  local_1c8._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1b8 = &local_1a8;
  local_1b0 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0xff;
  macroName_49.m_size = 10;
  macroName_49.m_start = "CHECK_THAT";
  capturedExpression_49.m_size = 0x1f;
  capturedExpression_49.m_start = "12., WithinRel( chunk.PA()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_49,(SourceLineInfo *)local_228,capturedExpression_49,
             ContinueOnFailure);
  local_1c8._0_8_ = (_func_int **)0x4028000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_228,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[10]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)local_1c8);
  bStack_1e7 = bVar1;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1e0 = (double *)local_1c8;
  local_1d8 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x100;
  macroName_50.m_size = 10;
  macroName_50.m_start = "CHECK_THAT";
  capturedExpression_50.m_size = 0x1f;
  capturedExpression_50.m_start = "13., WithinRel( chunk.PA()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_50,(SourceLineInfo *)local_228,capturedExpression_50,
             ContinueOnFailure);
  local_1a8._M_current = (double *)0x402a000000000000;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1e0 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start + 10;
  local_1d8 = (WithinRelMatcher *)0xc;
  lVar3 = (long)unique0x00012000 - (long)local_1e0 >> 3;
  lVar2 = (long)unique0x00012000 - (long)local_1e0 >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_1d0 = 0xc - lVar3;
  if (lVar3 == 0) {
    local_1d0 = 0;
  }
  local_c8 = local_1f0;
  local_d0._M_current = local_1e0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_c8,&local_d0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_228,*local_d0._M_current);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)&local_1a8);
  bStack_1bf = bVar1;
  local_1c8[8] = true;
  local_1c8._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1b8 = &local_1a8;
  local_1b0 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x101;
  macroName_51.m_size = 10;
  macroName_51.m_start = "CHECK_THAT";
  capturedExpression_51.m_size = 0x2c;
  capturedExpression_51.m_start = "12., WithinRel( chunk.parityParticleA()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_51,(SourceLineInfo *)local_228,capturedExpression_51,
             ContinueOnFailure);
  local_1c8._0_8_ = (_func_int **)0x4028000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_228,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[10]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)local_1c8);
  bStack_1e7 = bVar1;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1e0 = (double *)local_1c8;
  local_1d8 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x102;
  macroName_52.m_size = 10;
  macroName_52.m_start = "CHECK_THAT";
  capturedExpression_52.m_size = 0x2c;
  capturedExpression_52.m_start = "13., WithinRel( chunk.parityParticleA()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_52,(SourceLineInfo *)local_228,capturedExpression_52,
             ContinueOnFailure);
  local_1a8._M_current = (double *)0x402a000000000000;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1e0 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start + 10;
  local_1d8 = (WithinRelMatcher *)0xc;
  lVar3 = (long)unique0x00012000 - (long)local_1e0 >> 3;
  lVar2 = (long)unique0x00012000 - (long)local_1e0 >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_1d0 = 0xc - lVar3;
  if (lVar3 == 0) {
    local_1d0 = 0;
  }
  local_b8 = local_1f0;
  local_c0._M_current = local_1e0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_b8,&local_c0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_228,*local_c0._M_current);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)&local_1a8);
  bStack_1bf = bVar1;
  local_1c8[8] = true;
  local_1c8._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1b8 = &local_1a8;
  local_1b0 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x103;
  macroName_53.m_size = 10;
  macroName_53.m_start = "CHECK_THAT";
  capturedExpression_53.m_size = 0x1f;
  capturedExpression_53.m_start = "14., WithinRel( chunk.PB()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_53,(SourceLineInfo *)local_228,capturedExpression_53,
             ContinueOnFailure);
  local_1c8._0_8_ = (_func_int **)0x402c000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_228,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[0xb]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)local_1c8);
  bStack_1e7 = bVar1;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1e0 = (double *)local_1c8;
  local_1d8 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x104;
  macroName_54.m_size = 10;
  macroName_54.m_start = "CHECK_THAT";
  capturedExpression_54.m_size = 0x1f;
  capturedExpression_54.m_start = "15., WithinRel( chunk.PB()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_54,(SourceLineInfo *)local_228,capturedExpression_54,
             ContinueOnFailure);
  local_1a8._M_current = (double *)0x402e000000000000;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1e0 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start + 0xb;
  local_1d8 = (WithinRelMatcher *)0xc;
  lVar3 = (long)unique0x00012000 - (long)local_1e0 >> 3;
  lVar2 = (long)unique0x00012000 - (long)local_1e0 >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_1d0 = 0xc - lVar3;
  if (lVar3 == 0) {
    local_1d0 = 0;
  }
  local_a8 = local_1f0;
  local_b0._M_current = local_1e0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_a8,&local_b0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_228,*local_b0._M_current);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)&local_1a8);
  bStack_1bf = bVar1;
  local_1c8[8] = true;
  local_1c8._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1b8 = &local_1a8;
  local_1b0 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x105;
  macroName_55.m_size = 10;
  macroName_55.m_start = "CHECK_THAT";
  capturedExpression_55.m_size = 0x2c;
  capturedExpression_55.m_start = "14., WithinRel( chunk.parityParticleB()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_55,(SourceLineInfo *)local_228,capturedExpression_55,
             ContinueOnFailure);
  local_1c8._0_8_ = (_func_int **)0x402c000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_228,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[0xb]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)local_1c8);
  bStack_1e7 = bVar1;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1e0 = (double *)local_1c8;
  local_1d8 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x106;
  macroName_56.m_size = 10;
  macroName_56.m_start = "CHECK_THAT";
  capturedExpression_56.m_size = 0x2c;
  capturedExpression_56.m_start = "15., WithinRel( chunk.parityParticleB()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_56,(SourceLineInfo *)local_228,capturedExpression_56,
             ContinueOnFailure);
  local_1a8._M_current = (double *)0x402e000000000000;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1e0 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start + 0xb;
  local_1d8 = (WithinRelMatcher *)0xc;
  lVar3 = (long)unique0x00012000 - (long)local_1e0 >> 3;
  lVar2 = (long)unique0x00012000 - (long)local_1e0 >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_1d0 = 0xc - lVar3;
  if (lVar3 == 0) {
    local_1d0 = 0;
  }
  local_98 = local_1f0;
  local_a0._M_current = local_1e0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_98,&local_a0,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_228,*local_a0._M_current);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)&local_1a8);
  bStack_1bf = bVar1;
  local_1c8[8] = true;
  local_1c8._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1b8 = &local_1a8;
  local_1b0 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x107;
  macroName_57.m_size = 10;
  macroName_57.m_start = "CHECK_THAT";
  capturedExpression_57.m_size = 0x1d;
  capturedExpression_57.m_start = "6., WithinRel( chunk.Q()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_57,(SourceLineInfo *)local_228,capturedExpression_57,
             ContinueOnFailure);
  local_1c8._0_8_ = (_func_int **)0x4018000000000000;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_228,
             (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start[6]);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)local_1c8);
  bStack_1e7 = bVar1;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1e0 = (double *)local_1c8;
  local_1d8 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x108;
  macroName_58.m_size = 10;
  macroName_58.m_start = "CHECK_THAT";
  capturedExpression_58.m_size = 0x1d;
  capturedExpression_58.m_start = "7., WithinRel( chunk.Q()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_58,(SourceLineInfo *)local_228,capturedExpression_58,
             ContinueOnFailure);
  local_1a8._M_current = (double *)0x401c000000000000;
  unique0x00012000 =
       (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1e0 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start + 6;
  local_1d8 = (WithinRelMatcher *)0xc;
  lVar3 = (long)unique0x00012000 - (long)local_1e0 >> 3;
  lVar2 = (long)unique0x00012000 - (long)local_1e0 >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_1d0 = 0xc - lVar3;
  if (lVar3 == 0) {
    local_1d0 = 0;
  }
  local_88 = local_1f0;
  local_90._M_current = local_1e0;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_88,&local_90,1);
  Catch::Matchers::WithinRel((WithinRelMatcher *)local_228,*local_90._M_current);
  bVar1 = Catch::Matchers::WithinRelMatcher::match
                    ((WithinRelMatcher *)local_228,(double *)&local_1a8);
  bStack_1bf = bVar1;
  local_1c8[8] = true;
  local_1c8._0_8_ = &PTR_streamReconstructedExpression_001d4238;
  local_1b8 = &local_1a8;
  local_1b0 = (WithinRelMatcher *)local_228;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1c8);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1c8);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x109;
  macroName_59.m_size = 5;
  macroName_59.m_start = "CHECK";
  capturedExpression_59.m_size = 0x13;
  capturedExpression_59.m_start = "8 == chunk.PNT()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_59,(SourceLineInfo *)local_228,capturedExpression_59,
             ContinueOnFailure);
  iVar4 = (int)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[7];
  local_220._1_1_ = iVar4 == 8;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d4178;
  local_220._4_4_ = 8;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  local_210._8_4_ = iVar4;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x10a;
  macroName_60.m_size = 5;
  macroName_60.m_start = "CHECK";
  capturedExpression_60.m_size = 0x13;
  capturedExpression_60.m_start = "9 == chunk.PNT()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_60,(SourceLineInfo *)local_228,capturedExpression_60,
             ContinueOnFailure);
  local_218 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_210._M_allocated_capacity =
       (size_type)
       ((chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start + 7);
  lVar3 = (long)((long)local_218 - local_210._M_allocated_capacity) >> 3;
  lVar2 = (long)((long)local_218 - local_210._M_allocated_capacity) >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_200 = (double)(0xc - lVar3);
  if (lVar3 == 0) {
    local_200 = 0.0;
  }
  local_210._8_8_ = 0xc;
  local_1f7 = '\x01';
  local_78._M_current = (double *)local_210._M_allocated_capacity;
  local_70 = &local_220;
  local_68 = &local_1f8;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_70,&local_78,1);
  bStack_1e7 = (int)*local_78._M_current == 9;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4178;
  uStack_1e4 = 9;
  local_1e0 = (double *)0x198da4;
  local_1d8 = (WithinRelMatcher *)0x2;
  local_1d0 = CONCAT44(local_1d0._4_4_,(int)*local_78._M_current);
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  if (local_1f7 == '\x01') {
    local_1f7 = '\0';
  }
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x10b;
  macroName_61.m_size = 5;
  macroName_61.m_start = "CHECK";
  capturedExpression_61.m_size = 0x21;
  capturedExpression_61.m_start = "8 == chunk.penetrabilityFlag()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_61,(SourceLineInfo *)local_228,capturedExpression_61,
             ContinueOnFailure);
  iVar4 = (int)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[7];
  local_220._1_1_ = iVar4 == 8;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d4178;
  local_220._4_4_ = 8;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  local_210._8_4_ = iVar4;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x10c;
  macroName_62.m_size = 5;
  macroName_62.m_start = "CHECK";
  capturedExpression_62.m_size = 0x21;
  capturedExpression_62.m_start = "9 == chunk.penetrabilityFlag()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_62,(SourceLineInfo *)local_228,capturedExpression_62,
             ContinueOnFailure);
  local_218 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_210._M_allocated_capacity =
       (size_type)
       ((chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start + 7);
  lVar3 = (long)((long)local_218 - local_210._M_allocated_capacity) >> 3;
  lVar2 = (long)((long)local_218 - local_210._M_allocated_capacity) >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_200 = (double)(0xc - lVar3);
  if (lVar3 == 0) {
    local_200 = 0.0;
  }
  local_210._8_8_ = 0xc;
  local_1f7 = '\x01';
  local_60._M_current = (double *)local_210._M_allocated_capacity;
  local_58 = &local_220;
  local_50 = &local_1f8;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_58,&local_60,1);
  bStack_1e7 = (int)*local_60._M_current == 9;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4178;
  uStack_1e4 = 9;
  local_1e0 = (double *)0x198da4;
  local_1d8 = (WithinRelMatcher *)0x2;
  local_1d0 = CONCAT44(local_1d0._4_4_,(int)*local_60._M_current);
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  if (local_1f7 == '\x01') {
    local_1f7 = '\0';
  }
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x10d;
  macroName_63.m_size = 5;
  macroName_63.m_start = "CHECK";
  capturedExpression_63.m_size = 0x14;
  capturedExpression_63.m_start = "10 == chunk.SHF()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_63,(SourceLineInfo *)local_228,capturedExpression_63,
             ContinueOnFailure);
  iVar4 = (int)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[8];
  local_220._1_1_ = iVar4 == 10;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d4178;
  local_220._4_4_ = 10;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  local_210._8_4_ = iVar4;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x10e;
  macroName_64.m_size = 5;
  macroName_64.m_start = "CHECK";
  capturedExpression_64.m_size = 0x14;
  capturedExpression_64.m_start = "11 == chunk.SHF()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_64,(SourceLineInfo *)local_228,capturedExpression_64,
             ContinueOnFailure);
  local_218 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_210._M_allocated_capacity =
       (size_type)
       ((chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start + 8);
  lVar3 = (long)((long)local_218 - local_210._M_allocated_capacity) >> 3;
  lVar2 = (long)((long)local_218 - local_210._M_allocated_capacity) >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_200 = (double)(0xc - lVar3);
  if (lVar3 == 0) {
    local_200 = 0.0;
  }
  local_210._8_8_ = 0xc;
  local_1f7 = '\x01';
  local_48._M_current = (double *)local_210._M_allocated_capacity;
  local_40 = &local_220;
  local_38 = &local_1f8;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_40,&local_48,1);
  bStack_1e7 = (int)*local_48._M_current == 0xb;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4178;
  uStack_1e4 = 0xb;
  local_1e0 = (double *)0x198da4;
  local_1d8 = (WithinRelMatcher *)0x2;
  local_1d0 = CONCAT44(local_1d0._4_4_,(int)*local_48._M_current);
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  if (local_1f7 == '\x01') {
    local_1f7 = '\0';
  }
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x10f;
  macroName_65.m_size = 5;
  macroName_65.m_start = "CHECK";
  capturedExpression_65.m_size = 0x20;
  capturedExpression_65.m_start = "10 == chunk.shiftFactorFlag()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_65,(SourceLineInfo *)local_228,capturedExpression_65,
             ContinueOnFailure);
  iVar4 = (int)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[8];
  local_220._1_1_ = iVar4 == 10;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d4178;
  local_220._4_4_ = 10;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  local_210._8_4_ = iVar4;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x110;
  macroName_66.m_size = 5;
  macroName_66.m_start = "CHECK";
  capturedExpression_66.m_size = 0x20;
  capturedExpression_66.m_start = "11 == chunk.shiftFactorFlag()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_66,(SourceLineInfo *)local_228,capturedExpression_66,
             ContinueOnFailure);
  local_218 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_210._M_allocated_capacity =
       (size_type)
       ((chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start + 8);
  lVar3 = (long)((long)local_218 - local_210._M_allocated_capacity) >> 3;
  lVar2 = (long)((long)local_218 - local_210._M_allocated_capacity) >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_200 = (double)(0xc - lVar3);
  if (lVar3 == 0) {
    local_200 = 0.0;
  }
  local_210._8_8_ = 0xc;
  local_1f7 = '\x01';
  local_1a8._M_current = (double *)local_210._M_allocated_capacity;
  local_1a0 = &local_220;
  local_198 = &local_1f8;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)&local_1a0,&local_1a8,1);
  bStack_1e7 = (int)*local_1a8._M_current == 0xb;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4178;
  uStack_1e4 = 0xb;
  local_1e0 = (double *)0x198da4;
  local_1d8 = (WithinRelMatcher *)0x2;
  local_1d0 = CONCAT44(local_1d0._4_4_,(int)*local_1a8._M_current);
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  if (local_1f7 == '\x01') {
    local_1f7 = '\0';
  }
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x111;
  macroName_67.m_size = 5;
  macroName_67.m_start = "CHECK";
  capturedExpression_67.m_size = 0x14;
  capturedExpression_67.m_start = "102 == chunk.MT()[0]";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_67,(SourceLineInfo *)local_228,capturedExpression_67,
             ContinueOnFailure);
  iVar4 = (int)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[9];
  local_220._1_1_ = iVar4 == 0x66;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d4178;
  local_220._4_4_ = 0x66;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  local_210._8_4_ = iVar4;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x112;
  macroName_68.m_size = 5;
  macroName_68.m_start = "CHECK";
  capturedExpression_68.m_size = 0x12;
  capturedExpression_68.m_start = "2 == chunk.MT()[1]";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_68,(SourceLineInfo *)local_228,capturedExpression_68,
             ContinueOnFailure);
  local_218 = (chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  local_210._M_allocated_capacity =
       (size_type)
       ((chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start + 9);
  lVar3 = (long)((long)local_218 - local_210._M_allocated_capacity) >> 3;
  lVar2 = (long)((long)local_218 - local_210._M_allocated_capacity) >> 0x3f;
  lVar3 = lVar3 + (((ulong)(lVar3 / 6 + lVar2) >> 1) - lVar2) * -0xc;
  local_200 = (double)(0xc - lVar3);
  if (lVar3 == 0) {
    local_200 = 0.0;
  }
  local_210._8_8_ = 0xc;
  local_1f7 = '\x01';
  local_1c8._0_8_ = local_210._M_allocated_capacity;
  unique0x1000674a = &local_220;
  local_1b8 = (iterator_t<CRng> *)&local_1f8;
  ranges::
  stride_view<ranges::subrange<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,(ranges::subrange_kind)1>>
  ::adaptor<false>::advance<concepts::detail::CPP_true_fn(concepts::detail::Nil)>
            ((adaptor<false> *)(local_1c8 + 8),(iterator_t<CRng> *)local_1c8,1);
  bStack_1e7 = (int)(double)*(_func_int **)local_1c8._0_8_ == 2;
  local_1f0[8] = true;
  local_1f0._0_8_ = &PTR_streamReconstructedExpression_001d4178;
  uStack_1e4 = 2;
  local_1e0 = (double *)0x198da4;
  local_1d8 = (WithinRelMatcher *)0x2;
  local_1d0 = CONCAT44(local_1d0._4_4_,(int)(double)*(_func_int **)local_1c8._0_8_);
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_1f0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_1f0);
  if (local_1f7 == '\x01') {
    local_1f7 = '\0';
  }
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  local_228 = (undefined1  [8])0x1974e4;
  local_220 = (pointer)0x114;
  macroName_69.m_size = 5;
  macroName_69.m_start = "CHECK";
  capturedExpression_69.m_size = 0xf;
  capturedExpression_69.m_start = "5 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&local_270,macroName_69,(SourceLineInfo *)local_228,capturedExpression_69,
             ContinueOnFailure);
  local_210._8_8_ =
       (((long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_finish -
         (long)(chunk->super_ListRecord).data.super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start >> 3) + 5) / 6 + 1;
  local_220._1_1_ = local_210._8_8_ == 5;
  local_220._0_1_ = true;
  local_228 = (undefined1  [8])&PTR_streamReconstructedExpression_001d42b8;
  local_220._4_4_ = 5;
  local_218 = (pointer)0x198da4;
  local_210._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&local_270,(ITransientExpression *)local_228);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_228);
  Catch::AssertionHandler::complete(&local_270);
  if (local_270.m_completed == false) {
    (*(local_270.m_resultCapture)->_vptr_IResultCapture[0x13])();
  }
  return;
}

Assistant:

void verifyChunk( const ParticlePairs& chunk ) {

  CHECK( 1 == chunk.NJSX() );
  CHECK( 1 == chunk.numberSpinGroups() );

  CHECK( 2 == chunk.NPP() );
  CHECK( 2 == chunk.numberParticlePairs() );
  CHECK( 2 == chunk.MA().size() );
  CHECK( 2 == chunk.massParticleA().size() );
  CHECK( 2 == chunk.MB().size() );
  CHECK( 2 == chunk.massParticleB().size() );
  CHECK( 2 == chunk.ZA().size() );
  CHECK( 2 == chunk.chargeParticleA().size() );
  CHECK( 2 == chunk.ZB().size() );
  CHECK( 2 == chunk.chargeParticleB().size() );
  CHECK( 2 == chunk.IA().size() );
  CHECK( 2 == chunk.spinParticleA().size() );
  CHECK( 2 == chunk.IB().size() );
  CHECK( 2 == chunk.spinParticleB().size() );
  CHECK( 2 == chunk.PA().size() );
  CHECK( 2 == chunk.parityParticleA().size() );
  CHECK( 2 == chunk.PB().size() );
  CHECK( 2 == chunk.parityParticleB().size() );
  CHECK( 2 == chunk.Q().size() );
  CHECK( 2 == chunk.PNT().size() );
  CHECK( 2 == chunk.penetrabilityFlag().size() );
  CHECK( 2 == chunk.SHF().size() );
  CHECK( 2 == chunk.shiftFactorFlag().size() );
  CHECK( 2 == chunk.MT().size() );

  CHECK_THAT( 0., WithinRel( chunk.MA()[0] ) );
  CHECK_THAT( 1., WithinRel( chunk.MA()[1] ) );
  CHECK_THAT( 0, WithinRel( chunk.massParticleA()[0] ) );
  CHECK_THAT( 1, WithinRel( chunk.massParticleA()[1] ) );
  CHECK_THAT( 5.446635e+1, WithinRel( chunk.MB()[0] ) );
  CHECK_THAT( 5.347624e+1, WithinRel( chunk.MB()[1] ) );
  CHECK_THAT( 5.446635e+1, WithinRel( chunk.massParticleB()[0] ) );
  CHECK_THAT( 5.347624e+1, WithinRel( chunk.massParticleB()[1] ) );
  CHECK_THAT( 2., WithinRel( chunk.ZA()[0] ) );
  CHECK_THAT( 3., WithinRel( chunk.ZA()[1] ) );
  CHECK_THAT( 2., WithinRel( chunk.chargeParticleA()[0] ) );
  CHECK_THAT( 3., WithinRel( chunk.chargeParticleA()[1] ) );
  CHECK_THAT( 26., WithinRel( chunk.ZB()[0] ) );
  CHECK_THAT( 27., WithinRel( chunk.ZB()[1] ) );
  CHECK_THAT( 26., WithinRel( chunk.chargeParticleB()[0] ) );
  CHECK_THAT( 27., WithinRel( chunk.chargeParticleB()[1] ) );
  CHECK_THAT( 1., WithinRel( chunk.IA()[0] ) );
  CHECK_THAT( 0.5, WithinRel( chunk.IA()[1] ) );
  CHECK_THAT( 1., WithinRel( chunk.spinParticleA()[0] ) );
  CHECK_THAT( 0.5, WithinRel( chunk.spinParticleA()[1] ) );
  CHECK_THAT( 4., WithinRel( chunk.IB()[0] ) );
  CHECK_THAT( 5., WithinRel( chunk.IB()[1] ) );
  CHECK_THAT( 4., WithinRel( chunk.spinParticleB()[0] ) );
  CHECK_THAT( 5., WithinRel( chunk.spinParticleB()[1] ) );
  CHECK_THAT( 12., WithinRel( chunk.PA()[0] ) );
  CHECK_THAT( 13., WithinRel( chunk.PA()[1] ) );
  CHECK_THAT( 12., WithinRel( chunk.parityParticleA()[0] ) );
  CHECK_THAT( 13., WithinRel( chunk.parityParticleA()[1] ) );
  CHECK_THAT( 14., WithinRel( chunk.PB()[0] ) );
  CHECK_THAT( 15., WithinRel( chunk.PB()[1] ) );
  CHECK_THAT( 14., WithinRel( chunk.parityParticleB()[0] ) );
  CHECK_THAT( 15., WithinRel( chunk.parityParticleB()[1] ) );
  CHECK_THAT( 6., WithinRel( chunk.Q()[0] ) );
  CHECK_THAT( 7., WithinRel( chunk.Q()[1] ) );
  CHECK( 8 == chunk.PNT()[0] );
  CHECK( 9 == chunk.PNT()[1] );
  CHECK( 8 == chunk.penetrabilityFlag()[0] );
  CHECK( 9 == chunk.penetrabilityFlag()[1] );
  CHECK( 10 == chunk.SHF()[0] );
  CHECK( 11 == chunk.SHF()[1] );
  CHECK( 10 == chunk.shiftFactorFlag()[0] );
  CHECK( 11 == chunk.shiftFactorFlag()[1] );
  CHECK( 102 == chunk.MT()[0] );
  CHECK( 2 == chunk.MT()[1] );

  CHECK( 5 == chunk.NC() );
}